

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_str_errorfn(arg_str *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *__s;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  fprintf((FILE *)fp,"%s: ",progname);
  if (errorcode == 2) {
    datatype = "";
    if (argval != (char *)0x0) {
      datatype = argval;
    }
    __s = "excess option ";
  }
  else {
    if (errorcode != 1) {
      return;
    }
    __s = "missing option ";
  }
  fputs(__s,(FILE *)fp);
  arg_print_option(fp,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_str_errorfn(
	struct arg_str * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	/* make argval NULL safe */
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (errorcode) {
		case EMINCOUNT:
			fputs("missing option ", fp);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;

		case EMAXCOUNT:
			fputs("excess option ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;
	}
}